

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL4RSrcDstSrcDstInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  undefined8 in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  uint *in_RDI;
  uint unaff_retaddr;
  DecodeStatus S;
  uint Op4;
  uint Op3;
  uint Op2;
  uint Op1;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffd4;
  uint64_t in_stack_ffffffffffffffd8;
  uint RegNo;
  undefined4 in_stack_fffffffffffffff0;
  
  RegNo = (uint)((ulong)in_RCX >> 0x20);
  uVar1 = fieldFromInstruction_4(in_ESI,0x10,4);
  fieldFromInstruction_4(in_ESI,0,0x10);
  local_34 = Decode3OpInstruction
                       (unaff_retaddr,in_RDI,(uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                        &in_RDX->OpcodePub);
  if (local_34 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
    local_34 = DecodeGRRegsRegisterClass
                         (in_RDX,RegNo,in_stack_ffffffffffffffd8,
                          (void *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
  }
  if (local_34 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,in_stack_ffffffffffffffd8,
               (void *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
  }
  return local_34;
}

Assistant:

static DecodeStatus DecodeL4RSrcDstSrcDstInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	unsigned Op4 = fieldFromInstruction_4(Insn, 16, 4);
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		S = DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	}

	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}